

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_object.hpp
# Opt level: O1

void __thiscall
webfront::http::std::experimental::net::v1::
basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
::~basic_io_object(basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
                   *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (this->implementation_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->implementation_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->implementation_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->implementation_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

~basic_io_object()
  {
    service_->destroy(implementation_);
  }